

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndirectObjectsReferenceRegistry.cpp
# Opt level: O0

EStatusCode __thiscall
IndirectObjectsReferenceRegistry::DeleteObject
          (IndirectObjectsReferenceRegistry *this,ObjectIDType inObjectID)

{
  size_type sVar1;
  Trace *pTVar2;
  reference pvVar3;
  ObjectIDType inObjectID_local;
  IndirectObjectsReferenceRegistry *this_local;
  
  sVar1 = std::vector<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>::size
                    (&this->mObjectsWritesRegistry);
  if (inObjectID < sVar1) {
    pvVar3 = std::vector<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>::
             operator[](&this->mObjectsWritesRegistry,inObjectID);
    if (pvVar3->mGenerationNumber == 0xffff) {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "IndirectObjectsReferenceRegistry::DeleteObject, object ID generation number reached maximum value and cannot be increased. ID = %ld"
                        ,inObjectID);
      this_local._4_4_ = eFailure;
    }
    else {
      pvVar3 = std::vector<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>::
               operator[](&this->mObjectsWritesRegistry,inObjectID);
      pvVar3->mIsDirty = true;
      pvVar3 = std::vector<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>::
               operator[](&this->mObjectsWritesRegistry,inObjectID);
      pvVar3->mGenerationNumber = pvVar3->mGenerationNumber + 1;
      pvVar3 = std::vector<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>::
               operator[](&this->mObjectsWritesRegistry,inObjectID);
      pvVar3->mWritePosition = 0;
      pvVar3 = std::vector<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>::
               operator[](&this->mObjectsWritesRegistry,inObjectID);
      pvVar3->mObjectReferenceType = Free;
      this_local._4_4_ = eSuccess;
    }
  }
  else {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,
                      "IndirectObjectsReferenceRegistry::DeleteObject, Out of range failure. An Object ID is marked for delete,but there\'s no such object. ID = %ld"
                      ,inObjectID);
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

PDFHummus::EStatusCode IndirectObjectsReferenceRegistry::DeleteObject(ObjectIDType inObjectID)
{
	if(mObjectsWritesRegistry.size() <= inObjectID)
	{
		TRACE_LOG1("IndirectObjectsReferenceRegistry::DeleteObject, Out of range failure. An Object ID is marked for delete,but there's no such object. ID = %ld",inObjectID);
		return PDFHummus::eFailure; 
	}

    if(mObjectsWritesRegistry[inObjectID].mGenerationNumber == 65535)
    {
		TRACE_LOG1("IndirectObjectsReferenceRegistry::DeleteObject, object ID generation number reached maximum value and cannot be increased. ID = %ld",inObjectID);
		return PDFHummus::eFailure; 
        
    }
    
    mObjectsWritesRegistry[inObjectID].mIsDirty = true;
    ++(mObjectsWritesRegistry[inObjectID].mGenerationNumber);
    mObjectsWritesRegistry[inObjectID].mWritePosition = 0;
    mObjectsWritesRegistry[inObjectID].mObjectReferenceType = ObjectWriteInformation::Free;
    
    return PDFHummus::eSuccess;
}